

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::GcAwakeTransientWindowBuffers(ImGuiWindow *window)

{
  long in_RDI;
  int in_stack_0000000c;
  ImVector<ImDrawVert> *in_stack_00000010;
  
  *(undefined1 *)(in_RDI + 0x400) = 0;
  ImVector<unsigned_int>::reserve((ImVector<unsigned_int> *)in_stack_00000010,in_stack_0000000c);
  ImVector<ImDrawVert>::reserve(in_stack_00000010,in_stack_0000000c);
  *(undefined4 *)(in_RDI + 0x408) = 0;
  *(undefined4 *)(in_RDI + 0x404) = 0;
  return;
}

Assistant:

void ImGui::GcAwakeTransientWindowBuffers(ImGuiWindow* window)
{
    // We stored capacity of the ImDrawList buffer to reduce growth-caused allocation/copy when awakening.
    // The other buffers tends to amortize much faster.
    window->MemoryCompacted = false;
    window->DrawList->IdxBuffer.reserve(window->MemoryDrawListIdxCapacity);
    window->DrawList->VtxBuffer.reserve(window->MemoryDrawListVtxCapacity);
    window->MemoryDrawListIdxCapacity = window->MemoryDrawListVtxCapacity = 0;
}